

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_mutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,signature *sig,
          sequence_number seq,public_key *pk,span<const_char> salt,address *addr)

{
  _Link_type n;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int32_t *piVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  size_t sVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  _Base_ptr *pp_Var15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  const_iterator __position;
  _Link_type __p;
  _Base_ptr p_Var19;
  _Base_ptr *pp_Var20;
  span<const_char> buf_00;
  span<const_char> buf_01;
  dht_mutable_item to_add;
  uint *local_168;
  _Base_ptr p_Stack_160;
  uint local_158 [2];
  dht_mutable_item local_150;
  
  p_Var18 = (_Rb_tree_node_base *)buf.m_len;
  p_Var1 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header;
  pp_Var20 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pp_Var15 = pp_Var20;
  p_Var17 = p_Var18;
  p_Var16 = &p_Var1->_M_header;
  while (p_Var4 = *pp_Var15, p_Var4 != (_Rb_tree_node_base *)0x0) {
    bVar12 = digest32<160L>::operator<((digest32<160L> *)(p_Var4 + 1),target);
    if (!bVar12) {
      p_Var16 = p_Var4;
    }
    pp_Var15 = &p_Var4->_M_left + bVar12;
  }
  if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
     (bVar12 = digest32<160L>::operator<(target,(digest32<160L> *)(p_Var16 + 1)), !bVar12)) {
    if ((long)p_Var16[8]._M_left < seq.value) {
      buf_00.m_len = (difference_type)p_Var17;
      buf_00.m_ptr = (char *)p_Var18;
      set_value((anon_unknown_0 *)&p_Var16[1]._M_right,(dht_immutable_item *)buf.m_ptr,buf_00);
      p_Var16[8]._M_left = (_Base_ptr)seq.value;
      p_Var19 = *(_Base_ptr *)((sig->bytes)._M_elems + 8);
      uVar6 = *(undefined8 *)((sig->bytes)._M_elems + 0x10);
      p_Var5 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x18);
      p_Var7 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x20);
      p_Var8 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x28);
      uVar9 = *(undefined8 *)((sig->bytes)._M_elems + 0x30);
      p_Var10 = *(_Base_ptr *)((sig->bytes)._M_elems + 0x38);
      p_Var16[6]._M_left = *(_Base_ptr *)(sig->bytes)._M_elems;
      p_Var16[6]._M_right = p_Var19;
      *(undefined8 *)(p_Var16 + 7) = uVar6;
      p_Var16[7]._M_parent = p_Var5;
      p_Var16[7]._M_left = p_Var7;
      p_Var16[7]._M_right = p_Var8;
      *(undefined8 *)(p_Var16 + 8) = uVar9;
      p_Var16[8]._M_parent = p_Var10;
    }
    goto LAB_00352e77;
  }
  sVar11 = (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar13 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar13 <= (int)sVar11) {
    __position._M_node =
         (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var16 = __position._M_node;
      p_Var4 = __position._M_node;
      while (__position._M_node = p_Var4,
            p_Var16 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var16),
            (_Rb_tree_header *)p_Var16 != p_Var1) {
        iVar13 = min_distance_exp((node_id *)(p_Var16 + 1),&this->m_node_ids);
        iVar14 = min_distance_exp((node_id *)(__position._M_node + 1),&this->m_node_ids);
        p_Var17 = p_Var16;
        p_Var4 = p_Var16;
        if (*(int *)&__position._M_node[6]._M_parent / 5 - iVar14 <=
            *(int *)&p_Var16[6]._M_parent / 5 - iVar13) {
          p_Var17 = __position._M_node;
          p_Var4 = __position._M_node;
        }
      }
    }
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_erase_aux(&(this->m_mutable_table)._M_t,__position);
    piVar3 = &(this->m_counters).mutable_data;
    *piVar3 = *piVar3 + -1;
  }
  memset(&to_add,0,0x100);
  to_add.salt._M_string_length = 0;
  to_add.salt.field_2._M_local_buf[0] = '\0';
  buf_01.m_len = (difference_type)p_Var17;
  buf_01.m_ptr = (char *)p_Var18;
  to_add.salt._M_dataplus._M_p = (pointer)&to_add.salt.field_2;
  set_value((anon_unknown_0 *)&to_add,(dht_immutable_item *)buf.m_ptr,buf_01);
  local_168 = local_158;
  to_add.seq.value = seq.value;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,salt.m_ptr,salt.m_ptr + salt.m_len);
  ::std::__cxx11::string::operator=((string *)&to_add.salt,(string *)&local_168);
  ::std::__cxx11::string::~string((string *)&local_168);
  to_add.sig.bytes._M_elems._0_8_ = *(undefined8 *)(sig->bytes)._M_elems;
  to_add.sig.bytes._M_elems._8_8_ = *(undefined8 *)((sig->bytes)._M_elems + 8);
  to_add.sig.bytes._M_elems._16_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x10);
  to_add.sig.bytes._M_elems._24_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x18);
  to_add.sig.bytes._M_elems._32_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x20);
  to_add.sig.bytes._M_elems._40_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x28);
  to_add.sig.bytes._M_elems._48_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x30);
  to_add.sig.bytes._M_elems._56_8_ = *(undefined8 *)((sig->bytes)._M_elems + 0x38);
  to_add.key.bytes._M_elems._0_8_ = *(undefined8 *)(pk->bytes)._M_elems;
  to_add.key.bytes._M_elems._8_8_ = *(undefined8 *)((pk->bytes)._M_elems + 8);
  to_add.key.bytes._M_elems._16_8_ = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  to_add.key.bytes._M_elems._24_8_ = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  local_158[0] = (target->m_number)._M_elems[4];
  local_168 = *(uint **)(target->m_number)._M_elems;
  p_Stack_160 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  dht_mutable_item::dht_mutable_item(&local_150,&to_add);
  p_Var17 = (_Rb_tree_node_base *)operator_new(0x158);
  n = (_Link_type)(p_Var17 + 1);
  *(uint *)&p_Var17[1]._M_left = local_158[0];
  *(uint **)(p_Var17 + 1) = local_168;
  p_Var17[1]._M_parent = p_Stack_160;
  dht_mutable_item::dht_mutable_item((dht_mutable_item *)&p_Var17[1]._M_right,&local_150);
  bVar12 = true;
  p_Var19 = &p_Var1->_M_header;
  while (p_Var5 = *pp_Var20, p_Var5 != (_Base_ptr)0x0) {
    bVar12 = digest32<160L>::operator<((digest32<160L> *)n,(digest32<160L> *)(p_Var5 + 1));
    p_Var19 = p_Var5;
    pp_Var20 = &p_Var5->_M_left + !bVar12;
  }
  p_Var16 = p_Var19;
  if (bVar12 == false) {
LAB_00352e04:
    __p = n;
    bVar12 = digest32<160L>::operator<((digest32<160L> *)(p_Var16 + 1),(digest32<160L> *)n);
    if (bVar12) goto LAB_00352e14;
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
                    *)p_Var17,__p);
  }
  else {
    if (p_Var19 != (this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var16 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var19);
      goto LAB_00352e04;
    }
LAB_00352e14:
    if (p_Var1 == (_Rb_tree_header *)p_Var19) {
      bVar12 = true;
    }
    else {
      bVar12 = digest32<160L>::operator<((digest32<160L> *)n,(digest32<160L> *)(p_Var19 + 1));
    }
    ::std::_Rb_tree_insert_and_rebalance(bVar12,p_Var17,p_Var19,&p_Var1->_M_header);
    psVar2 = &(this->m_mutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
    p_Var16 = p_Var17;
  }
  dht_mutable_item::~dht_mutable_item(&local_150);
  piVar3 = &(this->m_counters).mutable_data;
  *piVar3 = *piVar3 + 1;
  dht_mutable_item::~dht_mutable_item(&to_add);
LAB_00352e77:
  touch_item((dht_immutable_item *)&p_Var16[1]._M_right,addr);
  return;
}

Assistant:

void put_mutable_item(sha1_hash const& target
			, span<char const> buf
			, signature const& sig
			, sequence_number const seq
			, public_key const& pk
			, span<char const> salt
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_mutable_table.find(target);
			if (i == m_mutable_table.end())
			{
				// this is the case where we don't have an item in this slot
				// make sure we don't add too many items
				if (int(m_mutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_mutable_table);

					TORRENT_ASSERT(j != m_mutable_table.end());
					m_mutable_table.erase(j);
					m_counters.mutable_data -= 1;
				}
				dht_mutable_item to_add;
				set_value(to_add, buf);
				to_add.seq = seq;
				to_add.salt = {salt.begin(), salt.end()};
				to_add.sig = sig;
				to_add.key = pk;

				std::tie(i, std::ignore) = m_mutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.mutable_data += 1;
			}
			else
			{
				// this is the case where we already have an item in this slot
				dht_mutable_item& item = i->second;

				if (item.seq < seq)
				{
					set_value(item, buf);
					item.seq = seq;
					item.sig = sig;
				}
			}

			touch_item(i->second, addr);
		}